

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O3

void Cbs0_ManAssign(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  Gia_Obj_t **ppGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  pGVar3 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = (uint)*(ulong *)pGVar3;
  if (((~uVar1 & 0x9fffffff) != 0) && ((int)uVar1 < 0 || (~uVar1 & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsCand(pObjR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x1bf,"void Cbs0_ManAssign(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  if ((uVar1 >> 0x1e & 1) == 0) {
    *(ulong *)pGVar3 =
         (*(ulong *)pGVar3 & 0xbfffffffbfffffff | (ulong)((uint)pObj & 1) << 0x3e) ^
         0x4000000040000000;
    iVar4 = (p->pProp).iTail;
    if (iVar4 == (p->pProp).nSize) {
      (p->pProp).nSize = iVar4 * 2;
      ppGVar2 = (p->pProp).pData;
      if (ppGVar2 == (Gia_Obj_t **)0x0) {
        ppGVar2 = (Gia_Obj_t **)malloc((long)iVar4 << 4);
      }
      else {
        ppGVar2 = (Gia_Obj_t **)realloc(ppGVar2,(long)iVar4 << 4);
        iVar4 = (p->pProp).iTail;
      }
      (p->pProp).pData = ppGVar2;
    }
    else {
      ppGVar2 = (p->pProp).pData;
    }
    (p->pProp).iTail = iVar4 + 1;
    ppGVar2[iVar4] = pGVar3;
    return;
  }
  __assert_fail("!Cbs0_VarIsAssigned(pObjR)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                ,0x1c0,"void Cbs0_ManAssign(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Cbs0_ManAssign( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    assert( Gia_ObjIsCand(pObjR) );
    assert( !Cbs0_VarIsAssigned(pObjR) );
    Cbs0_VarAssign( pObjR );
    Cbs0_VarSetValue( pObjR, !Gia_IsComplement(pObj) );
    Cbs0_QuePush( &p->pProp, pObjR );
}